

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O0

void mpz_set(__mpz_struct *r,__mpz_struct *x)

{
  long size;
  mp_ptr local_38;
  int local_2c;
  mp_ptr rp;
  mp_size_t n;
  __mpz_struct *x_local;
  __mpz_struct *r_local;
  
  if (r != x) {
    if (x->_mp_size < 0) {
      local_2c = -x->_mp_size;
    }
    else {
      local_2c = x->_mp_size;
    }
    size = (long)local_2c;
    if (r->_mp_alloc < size) {
      local_38 = mpz_realloc(r,size);
    }
    else {
      local_38 = r->_mp_d;
    }
    mpn_copyi(local_38,x->_mp_d,size);
    r->_mp_size = x->_mp_size;
  }
  return;
}

Assistant:

void
mpz_set (mpz_t r, const mpz_t x)
{
  /* Allow the NOP r == x */
  if (r != x)
    {
      mp_size_t n;
      mp_ptr rp;

      n = GMP_ABS (x->_mp_size);
      rp = MPZ_REALLOC (r, n);

      mpn_copyi (rp, x->_mp_d, n);
      r->_mp_size = x->_mp_size;
    }
}